

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O3

CBData * __thiscall asmjit::CodeBuilder::newDataNode(CodeBuilder *this,void *data,uint32_t size)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  Error EVar4;
  int iVar5;
  Error extraout_EAX;
  CBData *pCVar6;
  CodeBuilder *pCVar7;
  size_t sVar8;
  undefined4 extraout_var;
  CBLabel *node;
  size_t extraout_RDX;
  ulong __n;
  CodeBuilder *__s;
  CodeBuilder *pCVar9;
  CodeBuilder *this_00;
  CodeBuilder *pCVar10;
  CBNode *pCVar11;
  size_t unaff_R13;
  size_t sStack_a0;
  CodeBuilder *pCStack_98;
  void *pvStack_90;
  CodeBuilder *pCStack_88;
  CodeBuilder *pCStack_80;
  size_t sStack_78;
  ulong uStack_70;
  CodeBuilder *pCStack_68;
  size_t sStack_58;
  ulong uStack_50;
  CodeBuilder *pCStack_48;
  CodeBuilder *pCStack_40;
  size_t local_30;
  
  __n = (ulong)size;
  this_00 = this;
  pCVar7 = (CodeBuilder *)data;
  if (size < 0x15) goto LAB_001123fa;
  this_00 = (CodeBuilder *)&this->_cbDataZone;
  unaff_R13 = (size_t)size;
  pCVar7 = (CodeBuilder *)(this->_cbDataZone)._ptr;
  puVar3 = (this->_cbDataZone)._end;
  if ((ulong)((long)puVar3 - (long)pCVar7) < unaff_R13) goto LAB_0011248f;
  puVar1 = (uint8_t *)((long)&(pCVar7->super_CodeEmitter)._vptr_CodeEmitter + unaff_R13);
  ((Zone *)this_00)->_ptr = puVar1;
  if (puVar1 <= puVar3) {
    while( true ) {
      if (pCVar7 == (CodeBuilder *)0x0) {
        return (CBData *)0x0;
      }
      if (data != (void *)0x0) {
        pCStack_40 = (CodeBuilder *)0x1123f5;
        this_00 = pCVar7;
        memcpy(pCVar7,data,unaff_R13);
      }
LAB_001123fa:
      if ((this->_cbHeap)._zone != (Zone *)0x0) break;
      pCStack_40 = (CodeBuilder *)0x11248f;
      newDataNode();
LAB_0011248f:
      pCStack_40 = (CodeBuilder *)0x112497;
      pCVar7 = (CodeBuilder *)Zone::_alloc((Zone *)this_00,unaff_R13);
    }
    pCStack_40 = (CodeBuilder *)0x11241e;
    pCVar6 = (CBData *)ZoneHeap::_alloc(&this->_cbHeap,0x40,&local_30);
    (pCVar6->super_CBNode)._prev = (CBNode *)0x0;
    (pCVar6->super_CBNode)._next = (CBNode *)0x0;
    (pCVar6->super_CBNode)._type = '\x02';
    (pCVar6->super_CBNode)._opCount = '\0';
    (pCVar6->super_CBNode)._flags = (uint16_t)this->_nodeFlags;
    (pCVar6->super_CBNode)._position = this->_position;
    (pCVar6->super_CBNode)._inlineComment = (char *)0x0;
    (pCVar6->super_CBNode)._passData = (void *)0x0;
    if (size < 0x15) {
      if (pCVar7 != (CodeBuilder *)0x0) {
        pCStack_40 = (CodeBuilder *)0x112468;
        memcpy(&pCVar6->field_0,pCVar7,__n);
      }
    }
    else {
      *(CodeBuilder **)&pCVar6->field_0 = pCVar7;
    }
    (pCVar6->field_0).field_0._size = size;
    return pCVar6;
  }
  pCStack_40 = (CodeBuilder *)newConstPool;
  __s = (CodeBuilder *)data;
  newDataNode();
  uStack_50 = __n;
  pCStack_48 = pCVar7;
  pCStack_40 = this;
  if ((this_00->_cbHeap)._zone != (Zone *)0x0) {
    pCStack_68 = (CodeBuilder *)0x1124d4;
    pCVar6 = (CBData *)ZoneHeap::_alloc(&this_00->_cbHeap,0x118,&sStack_58);
    (pCVar6->super_CBNode)._prev = (CBNode *)0x0;
    (pCVar6->super_CBNode)._next = (CBNode *)0x0;
    (pCVar6->super_CBNode)._type = '\x04';
    (pCVar6->super_CBNode)._opCount = '\0';
    (pCVar6->super_CBNode)._flags = (uint16_t)this_00->_nodeFlags;
    (pCVar6->super_CBNode)._position = this_00->_position;
    (pCVar6->super_CBNode)._inlineComment = (char *)0x0;
    (pCVar6->super_CBNode)._passData = (void *)0x0;
    (pCVar6->field_0).field_1._externalPtr = (uint8_t *)0xffffffff;
    *(CBJump **)((long)&pCVar6->field_0 + 8) = (CBJump *)0x0;
    pCStack_68 = (CodeBuilder *)0x11251e;
    ConstPool::ConstPool((ConstPool *)((long)&pCVar6->field_0 + 0x10),&this_00->_cbBaseZone);
    (pCVar6->super_CBNode)._type = '\x06';
    pCStack_68 = (CodeBuilder *)0x11252e;
    EVar4 = registerLabelNode(this_00,(CBLabel *)pCVar6);
    if (EVar4 != 0) {
      pCVar6 = (CBData *)0x0;
    }
    return pCVar6;
  }
  pCStack_68 = (CodeBuilder *)newCommentNode;
  newConstPool();
  pCVar9 = __s;
  pCVar10 = this_00;
  uStack_70 = __n;
  pCStack_68 = pCVar7;
  if (__s == (CodeBuilder *)0x0) {
    pCVar7 = (CodeBuilder *)0x0;
  }
  else {
    sVar8 = extraout_RDX;
    if (extraout_RDX == 0xffffffffffffffff) {
      pCStack_80 = (CodeBuilder *)0x112563;
      pCVar10 = __s;
      sVar8 = strlen((char *)__s);
    }
    pCVar7 = __s;
    if (sVar8 != 0) {
      pCVar10 = (CodeBuilder *)&this_00->_cbDataZone;
      pCStack_80 = (CodeBuilder *)0x11257f;
      iVar5 = Zone::dup((Zone *)pCVar10,(int)__s);
      pCVar7 = (CodeBuilder *)CONCAT44(extraout_var,iVar5);
      pCVar9 = __s;
      if (pCVar7 == (CodeBuilder *)0x0) {
        return (CBData *)0x0;
      }
    }
  }
  if ((this_00->_cbHeap)._zone != (Zone *)0x0) {
    pCStack_80 = (CodeBuilder *)0x1125ab;
    pCVar6 = (CBData *)ZoneHeap::_alloc(&this_00->_cbHeap,0x28,&sStack_78);
    (pCVar6->super_CBNode)._prev = (CBNode *)0x0;
    (pCVar6->super_CBNode)._next = (CBNode *)0x0;
    (pCVar6->super_CBNode)._type = '\a';
    (pCVar6->super_CBNode)._opCount = '\0';
    uVar2 = this_00->_nodeFlags;
    (pCVar6->super_CBNode)._position = this_00->_position;
    (pCVar6->super_CBNode)._passData = (void *)0x0;
    (pCVar6->super_CBNode)._flags = (ushort)uVar2 | 0xc;
    (pCVar6->super_CBNode)._inlineComment = (char *)pCVar7;
    return pCVar6;
  }
  pCStack_80 = (CodeBuilder *)newLabel;
  newCommentNode();
  pCVar11 = (CBNode *)0xffffffff00000004;
  if ((pCVar9->super_CodeEmitter)._lastError == 0) {
    pCStack_98 = pCVar7;
    pvStack_90 = data;
    pCStack_88 = this_00;
    pCStack_80 = this;
    if ((pCVar9->_cbHeap)._zone == (Zone *)0x0) {
      newLabel();
      EVar4 = extraout_EAX;
    }
    else {
      node = (CBLabel *)ZoneHeap::_alloc(&pCVar9->_cbHeap,0x38,&sStack_a0);
      (node->super_CBNode)._prev = (CBNode *)0x0;
      (node->super_CBNode)._next = (CBNode *)0x0;
      (node->super_CBNode)._type = '\x04';
      (node->super_CBNode)._opCount = '\0';
      (node->super_CBNode)._flags = (uint16_t)pCVar9->_nodeFlags;
      (node->super_CBNode)._position = pCVar9->_position;
      (node->super_CBNode)._inlineComment = (char *)0x0;
      (node->super_CBNode)._passData = (void *)0x0;
      node->_id = 0xffffffff;
      node->_numRefs = 0;
      node->_from = (CBJump *)0x0;
      EVar4 = registerLabelNode(pCVar9,node);
      if (EVar4 == 0) {
        pCVar11 = (CBNode *)((ulong)node->_id << 0x20 | 4);
        goto LAB_00112680;
      }
    }
    CodeEmitter::setLastError(&pCVar9->super_CodeEmitter,EVar4,(char *)0x0);
  }
LAB_00112680:
  (pCVar10->super_CodeEmitter)._vptr_CodeEmitter = (_func_int **)pCVar11;
  *(CBNode **)&(pCVar10->super_CodeEmitter)._codeInfo = (CBNode *)0x0;
  return (CBData *)pCVar10;
}

Assistant:

CBData* CodeBuilder::newDataNode(const void* data, uint32_t size) noexcept {
  if (size > CBData::kInlineBufferSize) {
    void* cloned = _cbDataZone.alloc(size);
    if (!cloned) return nullptr;

    if (data) ::memcpy(cloned, data, size);
    data = cloned;
  }

  return newNodeT<CBData>(const_cast<void*>(data), size);
}